

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O3

base_learner * sender_setup(options_i *options,vw *all)

{
  undefined8 uVar1;
  int iVar2;
  sender *s;
  example **ppeVar3;
  learner<sender,_example> *plVar4;
  string host;
  option_group_definition sender_options;
  undefined1 *local_248;
  long local_240;
  undefined1 local_238 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  option_group_definition local_208;
  string local_1d0;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  string local_190;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_248 = local_238;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Network sending","");
  local_208.m_name._M_dataplus._M_p = (pointer)&local_208.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_208,local_248,local_248 + local_240);
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_248 != local_238) {
    operator_delete(local_248);
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"sendto","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_170,&local_190,&local_228);
  local_100 = true;
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"send examples to <host>","");
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_d0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_170);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_208,&local_d0);
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd158;
  if (local_d0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0]);
  }
  local_170._0_8_ = &PTR__typed_option_002cd158;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_208);
  local_170._0_8_ = local_170 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"sendto","");
  iVar2 = (*options->_vptr_options_i[1])(options,local_170);
  if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
    operator_delete((void *)local_170._0_8_);
  }
  if ((char)iVar2 == '\0') {
    plVar4 = (learner<sender,_example> *)0x0;
  }
  else {
    s = calloc_or_throw<sender>(1);
    s->sent_index = 0;
    s->received_index = 0;
    s->all = (vw *)0x0;
    s->delay_ring = (example **)0x0;
    s->buf = (io_buf *)0x0;
    *(undefined8 *)&s->sd = 0;
    local_170._0_8_ = destroy_free<sender>;
    s->sd = -1;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    local_170._8_8_ = s;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d0,local_228._M_dataplus._M_p,
               local_228._M_dataplus._M_p + local_228._M_string_length);
    open_sockets(s,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    s->all = all;
    ppeVar3 = calloc_or_throw<example*>(all->p->ring_size);
    s->delay_ring = ppeVar3;
    plVar4 = LEARNER::init_learner<sender,example,LEARNER::learner<char,example>>
                       ((free_ptr<sender> *)local_170,learn,learn,1);
    uVar1 = *(undefined8 *)(plVar4 + 0x18);
    *(undefined8 *)(plVar4 + 0xb8) = uVar1;
    *(undefined8 *)(plVar4 + 0xc0) = *(undefined8 *)(plVar4 + 0x20);
    *(code **)(plVar4 + 200) = finish;
    *(undefined8 *)(plVar4 + 0x58) = uVar1;
    *(code **)(plVar4 + 0x68) = finish_example;
    *(undefined8 *)(plVar4 + 0xa0) = uVar1;
    *(undefined8 *)(plVar4 + 0xa8) = *(undefined8 *)(plVar4 + 0x20);
    *(code **)(plVar4 + 0xb0) = end_examples;
    if ((sender *)local_170._8_8_ != (sender *)0x0) {
      (*(code *)local_170._0_8_)((void *)local_170._8_8_);
    }
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_208.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_name._M_dataplus._M_p != &local_208.m_name.field_2) {
    operator_delete(local_208.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  return (base_learner *)plVar4;
}

Assistant:

LEARNER::base_learner* sender_setup(options_i& options, vw& all)
{
  string host;

  option_group_definition sender_options("Network sending");
  sender_options.add(make_option("sendto", host).keep().help("send examples to <host>"));
  options.add_and_parse(sender_options);

  if (!options.was_supplied("sendto"))
  {
    return nullptr;
  }

  auto s = scoped_calloc_or_throw<sender>();
  s->sd = -1;
  open_sockets(*s.get(), host);

  s->all = &all;
  s->delay_ring = calloc_or_throw<example*>(all.p->ring_size);

  LEARNER::learner<sender, example>& l = init_learner(s, learn, learn, 1);
  l.set_finish(finish);
  l.set_finish_example(finish_example);
  l.set_end_examples(end_examples);
  return make_base(l);
}